

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic.h
# Opt level: O0

void ncnn::interpolate_cubic(float fx,float *coeffs)

{
  float fVar1;
  float fVar2;
  float fx2;
  float fx1;
  float fx0;
  float A;
  float *coeffs_local;
  float fx_local;
  
  fVar1 = fx + 1.0;
  fVar2 = 1.0 - fx;
  *coeffs = ((fVar1 * -0.75 * fVar1 * fVar1 - fVar1 * -3.75 * fVar1) + fVar1 * -6.0) - -3.0;
  coeffs[1] = (fx * 1.25 * fx * fx - fx * 2.25 * fx) + 1.0;
  coeffs[2] = (fVar2 * 1.25 * fVar2 * fVar2 - fVar2 * 2.25 * fVar2) + 1.0;
  coeffs[3] = ((1.0 - *coeffs) - coeffs[1]) - coeffs[2];
  return;
}

Assistant:

static inline void interpolate_cubic(float fx, float* coeffs)
{
    const float A = -0.75f;

    float fx0 = fx + 1;
    float fx1 = fx;
    float fx2 = 1 - fx;
    // float fx3 = 2 - fx;

    coeffs[0] = A * fx0 * fx0 * fx0 - 5 * A * fx0 * fx0 + 8 * A * fx0 - 4 * A;
    coeffs[1] = (A + 2) * fx1 * fx1 * fx1 - (A + 3) * fx1 * fx1 + 1;
    coeffs[2] = (A + 2) * fx2 * fx2 * fx2 - (A + 3) * fx2 * fx2 + 1;
    coeffs[3] = 1.f - coeffs[0] - coeffs[1] - coeffs[2];
}